

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

ostream * __thiscall smf::Options::print(Options *this,ostream *out)

{
  pointer ppOVar1;
  ostream *poVar2;
  Option_register **item;
  pointer ppOVar3;
  
  ppOVar1 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar3 = (this->m_optionRegister).
                 super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppOVar3 != ppOVar1;
      ppOVar3 = ppOVar3 + 1) {
    poVar2 = std::operator<<(out,(string *)*ppOVar3);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,(string *)&(*ppOVar3)->m_description);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return out;
}

Assistant:

std::ostream& Options::print(std::ostream& out) {
	for (auto &item : m_optionRegister) {
		out << item->getDefinition() << "\t"
			  << item->getDescription() << std::endl;
	}
	return out;
}